

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<pbrt::RGBIlluminantSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>_>
::reserve(vector<pbrt::RGBIlluminantSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>_>
          *this,size_t n)

{
  RGBIlluminantSpectrum *pRVar1;
  iterator pRVar2;
  ulong in_RSI;
  vector<pbrt::RGBIlluminantSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>_>
  *in_RDI;
  int i;
  RGBIlluminantSpectrum *ra;
  RGBIlluminantSpectrum *in_stack_ffffffffffffffc8;
  RGBIlluminantSpectrum *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    pRVar1 = pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>::
             allocate_object<pbrt::RGBIlluminantSpectrum>
                       ((polymorphic_allocator<pbrt::RGBIlluminantSpectrum> *)
                        in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = pRVar1 + local_1c;
      pRVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>::
      construct<pbrt::RGBIlluminantSpectrum,pbrt::RGBIlluminantSpectrum>
                (&in_RDI->alloc,in_stack_ffffffffffffffd0,pRVar2 + local_1c);
      pRVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>::destroy<pbrt::RGBIlluminantSpectrum>
                (&in_RDI->alloc,pRVar2 + local_1c);
    }
    pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>::
    deallocate_object<pbrt::RGBIlluminantSpectrum>
              ((polymorphic_allocator<pbrt::RGBIlluminantSpectrum> *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8,0x7d0554);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = pRVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }